

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O3

void map2json_destroy(map2json_t *obj)

{
  map2json_freePairsMemory(obj->pairs);
  map2json_freeTreeMemory(obj->tree);
  safe_destroy(obj->buffer);
  free(obj);
  return;
}

Assistant:

void map2json_destroy(map2json_t *obj) {
	DEBUG_PUT("map2json_destroy([map2json_t *])... ");
	map2json_freePairsMemory(obj->pairs);
	map2json_freeTreeMemory(obj->tree);
	safe_destroy(obj->buffer);
	free(obj);
	DEBUG_PUT("map2json_destroy([map2json_t *])... DONE");
}